

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PPointer * NewPointer(PType *type,bool isconst)

{
  size_t in_RAX;
  PPointer *this;
  undefined7 in_register_00000031;
  ulong parm2;
  size_t bucket;
  size_t local_28;
  
  parm2 = CONCAT71(in_register_00000031,isconst) & 0xffffffff;
  local_28 = in_RAX;
  this = (PPointer *)
         FTypeTable::FindType
                   (&TypeTable,PPointer::RegistrationInfo.MyClass,(intptr_t)type,parm2,&local_28);
  if (this == (PPointer *)0x0) {
    this = (PPointer *)
           M_Malloc_Dbg(0xa8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                        ,0x1f9);
    PPointer::PPointer(this,type,isconst);
    FTypeTable::AddType(&TypeTable,(PType *)this,PPointer::RegistrationInfo.MyClass,(intptr_t)type,
                        parm2,local_28);
  }
  return this;
}

Assistant:

PPointer *NewPointer(PType *type, bool isconst)
{
	size_t bucket;
	PType *ptype = TypeTable.FindType(RUNTIME_CLASS(PPointer), (intptr_t)type, isconst ? 1 : 0, &bucket);
	if (ptype == NULL)
	{
		ptype = new PPointer(type, isconst);
		TypeTable.AddType(ptype, RUNTIME_CLASS(PPointer), (intptr_t)type, isconst ? 1 : 0, bucket);
	}
	return static_cast<PPointer *>(ptype);
}